

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

TypeOpCallother * __thiscall
TypeOpCallother::getOperatorName_abi_cxx11_(TypeOpCallother *this,PcodeOp *op)

{
  BlockBasic *this_00;
  Funcdata *this_01;
  Architecture *pAVar1;
  Varnode *pVVar2;
  uintb uVar3;
  UserPcodeOp *pUVar4;
  ostream *poVar5;
  PcodeOp *in_RDX;
  undefined1 local_1d8 [40];
  ostringstream res;
  UserPcodeOp *userop;
  int4 index;
  Architecture *glb;
  BlockBasic *bb;
  PcodeOp *op_local;
  TypeOpCallother *this_local;
  
  this_00 = PcodeOp::getParent(in_RDX);
  if (this_00 != (BlockBasic *)0x0) {
    this_01 = BlockBasic::getFuncdata(this_00);
    pAVar1 = Funcdata::getArch(this_01);
    pVVar2 = PcodeOp::getIn(in_RDX,0);
    uVar3 = Varnode::getOffset(pVVar2);
    pUVar4 = UserOpManage::getOp(&pAVar1->userops,(int4)uVar3);
    if (pUVar4 != (UserPcodeOp *)0x0) {
      (*pUVar4->_vptr_UserPcodeOp[2])(this,pUVar4,in_RDX);
      return this;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d8 + 0x20));
  TypeOp::getOperatorName_abi_cxx11_((TypeOp *)local_1d8,op);
  poVar5 = std::operator<<((ostream *)(local_1d8 + 0x20),(string *)local_1d8);
  std::operator<<(poVar5,'[');
  std::__cxx11::string::~string((string *)local_1d8);
  pVVar2 = PcodeOp::getIn(in_RDX,0);
  Varnode::printRaw(pVVar2,(ostream *)(local_1d8 + 0x20));
  std::operator<<((ostream *)(local_1d8 + 0x20),']');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d8 + 0x20));
  return this;
}

Assistant:

string TypeOpCallother::getOperatorName(const PcodeOp *op) const

{
  const BlockBasic *bb = op->getParent();
  if (bb != (BlockBasic *)0) {
   Architecture *glb = bb->getFuncdata()->getArch();
   int4 index = op->getIn(0)->getOffset();
    UserPcodeOp *userop = glb->userops.getOp(index);
    if (userop != (UserPcodeOp *)0)
      return userop->getOperatorName(op);
  }
  ostringstream res;
  res << TypeOp::getOperatorName(op) << '[';
  op->getIn(0)->printRaw(res);
  res << ']';
  return res.str();
}